

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void pop_heap_suite::pop_decreasing_custom(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined1 local_a0 [8];
  array<int,_5UL> expect_4;
  array<int,_5UL> expect_3;
  array<int,_5UL> expect_2;
  array<int,_5UL> expect_1;
  array<int,_5UL> expect;
  iterator last;
  array<int,_5UL> heap;
  xless<int,_1431655765> custom;
  
  last = (iterator)0x370000002c;
  heap._M_elems[0] = 0x21;
  heap._M_elems[1] = 0x16;
  heap._M_elems[2] = 0xb;
  pvVar1 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  vista::pop_heap<int*,xless<int,1431655765>>(pvVar2,pvVar1);
  pvVar1[-1] = 0;
  stack0xffffffffffffffc0 = 0x3700000021;
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  pvVar3 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar4 = std::array<int,_5UL>::begin((array<int,_5UL> *)(expect_1._M_elems + 4));
  pvVar5 = std::array<int,_5UL>::end((array<int,_5UL> *)(expect_1._M_elems + 4));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,699,"void pop_heap_suite::pop_decreasing_custom()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  vista::pop_heap<int*,xless<int,1431655765>>(pvVar2,pvVar1 + -1);
  pvVar1[-2] = 0;
  stack0xffffffffffffffa8 = 0x1600000037;
  expect_1._M_elems[0] = 0xb;
  expect_1._M_elems[1] = 0;
  expect_1._M_elems[2] = 0;
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  pvVar3 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar4 = std::array<int,_5UL>::begin((array<int,_5UL> *)(expect_2._M_elems + 4));
  pvVar5 = std::array<int,_5UL>::end((array<int,_5UL> *)(expect_2._M_elems + 4));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2c2,"void pop_heap_suite::pop_decreasing_custom()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  vista::pop_heap<int*,xless<int,1431655765>>(pvVar2,pvVar1 + -2);
  pvVar1[-3] = 0;
  stack0xffffffffffffff90 = 0x160000000b;
  expect_2._M_elems[0] = 0;
  expect_2._M_elems[1] = 0;
  expect_2._M_elems[2] = 0;
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  pvVar3 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar4 = std::array<int,_5UL>::begin((array<int,_5UL> *)(expect_3._M_elems + 4));
  pvVar5 = std::array<int,_5UL>::end((array<int,_5UL> *)(expect_3._M_elems + 4));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2c9,"void pop_heap_suite::pop_decreasing_custom()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  vista::pop_heap<int*,xless<int,1431655765>>(pvVar2,pvVar1 + -3);
  pvVar1[-4] = 0;
  stack0xffffffffffffff78 = 0x16;
  expect_3._M_elems[0] = 0;
  expect_3._M_elems[1] = 0;
  expect_3._M_elems[2] = 0;
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  pvVar3 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar4 = std::array<int,_5UL>::begin((array<int,_5UL> *)(expect_4._M_elems + 4));
  pvVar5 = std::array<int,_5UL>::end((array<int,_5UL> *)(expect_4._M_elems + 4));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2d0,"void pop_heap_suite::pop_decreasing_custom()",pvVar2,pvVar3,pvVar4,pvVar5);
  pvVar2 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  vista::pop_heap<int*,xless<int,1431655765>>(pvVar2);
  pvVar1[-5] = 0;
  memset(local_a0,0,0x14);
  pvVar1 = std::array<int,_5UL>::begin((array<int,_5UL> *)&last);
  pvVar2 = std::array<int,_5UL>::end((array<int,_5UL> *)&last);
  pvVar3 = std::array<int,_5UL>::begin((array<int,_5UL> *)local_a0);
  pvVar4 = std::array<int,_5UL>::end((array<int,_5UL> *)local_a0);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2d7,"void pop_heap_suite::pop_decreasing_custom()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void pop_decreasing_custom()
{
    xless<int, 0x55555555> custom;

    std::array<int, 5> heap = { 44, 55, 33, 22, 11 }; // Result of push_suite::push_decreasing_custom
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 33, 55, 11, 22, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 55, 22, 11, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 11, 22, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 22, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, custom);
    *--last = 0;
    {
        std::array<int, 5> expect = { 0, 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}